

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<bool>::RepeatedField
          (RepeatedField<bool> *this,RepeatedField<bool> *other)

{
  Arena *pAVar1;
  RepeatedField<bool> *in_RDI;
  RepeatedField<bool> *in_stack_00000098;
  RepeatedField<bool> *in_stack_000000a0;
  RepeatedField<bool> *in_stack_ffffffffffffffd8;
  
  RepeatedField(in_RDI);
  pAVar1 = GetArena(in_RDI);
  if (pAVar1 == (Arena *)0x0) {
    InternalSwap(in_stack_000000a0,in_stack_00000098);
  }
  else {
    CopyFrom(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(RepeatedField&& other) noexcept
    : RepeatedField() {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // other is on an arena. This field can't be on an arena because arena
  // construction always uses the Arena* accepting constructor.
  if (other.GetArena()) {
    CopyFrom(other);
  } else {
    InternalSwap(&other);
  }
}